

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

bool __thiscall
duckdb::BitpackingState<long,_long>::Flush<duckdb::EmptyBitpackingWriter>
          (BitpackingState<long,_long> *this)

{
  long *plVar1;
  bool bVar2;
  idx_t iVar3;
  unsigned_long uVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  ulong uVar8;
  byte bVar9;
  ulong uVar10;
  bool bVar11;
  long lVar12;
  long left;
  ulong uVar13;
  
  bVar11 = true;
  if (this->compression_buffer_idx == 0) {
    return true;
  }
  if (this->all_invalid == false) {
    lVar12 = this->minimum;
    left = this->maximum;
    if (left != lVar12) goto LAB_01072edf;
  }
  if ((byte)(this->mode - AUTO) < 2) {
    this->total_size = this->total_size + 0xc;
    return true;
  }
  lVar12 = this->minimum;
  left = this->maximum;
LAB_01072edf:
  plVar1 = &this->min_max_diff;
  bVar2 = TrySubtractOperator::Operation<long,long,long>(left,lVar12,plVar1);
  this->can_do_for = bVar2;
  CalculateDeltaStats(this);
  if (this->can_do_delta == true) {
    lVar12 = this->minimum_delta;
    if ((this->maximum_delta == lVar12) && ((this->mode & ~AUTO) != DELTA_FOR)) {
      this->total_size = this->total_size + 0x14;
      return true;
    }
    if (this->min_max_delta_diff == 0) {
      bVar7 = 0;
    }
    else {
      bVar9 = 0;
      uVar13 = this->min_max_delta_diff;
      do {
        bVar9 = bVar9 + 1;
        bVar2 = 1 < uVar13;
        uVar13 = (long)uVar13 >> 1;
      } while (bVar2);
      bVar7 = 0x40;
      if (bVar9 < 0x39) {
        bVar7 = bVar9;
      }
    }
    uVar13 = *plVar1;
    if (uVar13 == 0) {
      bVar6 = 0;
    }
    else {
      uVar8 = -uVar13;
      if (0 < (long)uVar13) {
        uVar8 = uVar13;
      }
      bVar9 = 0;
      do {
        bVar5 = bVar9;
        bVar9 = bVar5 + 1;
        bVar2 = 1 < uVar8;
        uVar8 = uVar8 >> 1;
      } while (bVar2);
      bVar6 = 0x40;
      if (bVar9 < 0x38) {
        bVar6 = bVar5 + 2;
      }
    }
    if ((bVar7 < bVar6) && (this->mode != FOR)) {
      if (this->compression_buffer_idx == 0) {
        iVar3 = this->total_size + 0x18;
        uVar13 = 0;
      }
      else {
        uVar8 = 0;
        do {
          this->delta_buffer[uVar8] = this->delta_buffer[uVar8] - lVar12;
          uVar8 = uVar8 + 1;
          uVar13 = this->compression_buffer_idx;
        } while (uVar8 < uVar13);
        iVar3 = this->total_size + 0x18;
        this->total_size = iVar3;
        if ((uVar13 & 0x1f) != 0) {
          uVar4 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar13 & 0x1f);
          uVar13 = (uVar13 - uVar4) + 0x20;
          iVar3 = this->total_size;
        }
      }
      this->total_size = (bVar7 * uVar13 >> 3) + iVar3;
      return true;
    }
  }
  if (this->can_do_for == true) {
    if (*plVar1 == 0) {
      uVar13 = 0;
    }
    else {
      bVar7 = 0;
      uVar13 = *plVar1;
      do {
        bVar7 = bVar7 + 1;
        bVar2 = 1 < uVar13;
        uVar13 = (long)uVar13 >> 1;
      } while (bVar2);
      bVar9 = 0x40;
      if (bVar7 < 0x39) {
        bVar9 = bVar7;
      }
      uVar13 = (ulong)bVar9;
    }
    if (this->compression_buffer_idx == 0) {
      uVar8 = 0;
    }
    else {
      plVar1 = this->compression_buffer;
      lVar12 = this->minimum;
      uVar10 = 0;
      do {
        plVar1[uVar10] = plVar1[uVar10] - lVar12;
        uVar10 = uVar10 + 1;
        uVar8 = this->compression_buffer_idx;
      } while (uVar10 < uVar8);
      if ((uVar8 & 0x1f) != 0) {
        uVar4 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar8 & 0x1f);
        uVar8 = (uVar8 - uVar4) + 0x20;
      }
    }
    this->total_size = this->total_size + (uVar8 * uVar13 >> 3) + 0x10;
  }
  else {
    bVar11 = false;
  }
  return bVar11;
}

Assistant:

bool Flush() {
		if (compression_buffer_idx == 0) {
			return true;
		}

		if ((all_invalid || maximum == minimum) && (mode == BitpackingMode::AUTO || mode == BitpackingMode::CONSTANT)) {
			OP::WriteConstant(maximum, compression_buffer_idx, data_ptr, all_invalid);
			total_size += sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
			return true;
		}

		CalculateFORStats();
		CalculateDeltaStats();

		if (can_do_delta) {
			if (maximum_delta == minimum_delta && mode != BitpackingMode::FOR && mode != BitpackingMode::DELTA_FOR) {
				// FOR needs to be T (considering hugeint is bigger than idx_t)
				T frame_of_reference = compression_buffer[0];

				OP::WriteConstantDelta(maximum_delta, static_cast<T>(frame_of_reference), compression_buffer_idx,
				                       compression_buffer, compression_buffer_validity, data_ptr);
				total_size += sizeof(T) + sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
				return true;
			}

			// Check if delta has benefit
			auto delta_required_bitwidth =
			    BitpackingPrimitives::MinimumBitWidth<T, false>(static_cast<T>(min_max_delta_diff));
			auto regular_required_bitwidth = BitpackingPrimitives::MinimumBitWidth(min_max_diff);

			if (delta_required_bitwidth < regular_required_bitwidth && mode != BitpackingMode::FOR) {
				SubtractFrameOfReference(delta_buffer, minimum_delta);

				OP::WriteDeltaFor(reinterpret_cast<T *>(delta_buffer), compression_buffer_validity,
				                  delta_required_bitwidth, static_cast<T>(minimum_delta), delta_offset,
				                  compression_buffer, compression_buffer_idx, data_ptr);

				// FOR (frame of reference).
				total_size += sizeof(T);
				// Aligned bitpacking width.
				total_size += AlignValue(sizeof(bitpacking_width_t));
				// Delta offset.
				total_size += sizeof(T);
				// Compressed data size.
				total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, delta_required_bitwidth);

				return true;
			}
		}

		if (can_do_for) {
			auto width = BitpackingPrimitives::MinimumBitWidth<T, false>(min_max_diff);
			SubtractFrameOfReference(compression_buffer, minimum);
			OP::WriteFor(compression_buffer, compression_buffer_validity, width, minimum, compression_buffer_idx,
			             data_ptr);

			total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, width);
			total_size += sizeof(T); // FOR value
			total_size += AlignValue(sizeof(bitpacking_width_t));

			return true;
		}

		return false;
	}